

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SGXMLScanner::scanRawAttrListforNameSpaces(SGXMLScanner *this,XMLSize_t attCount)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  ushort uVar5;
  XMLValidator *pXVar6;
  undefined2 *puVar7;
  SchemaValidator *pSVar8;
  XMLBufferMgr *pXVar9;
  int iVar10;
  uint uVar11;
  KVStringPair *pKVar12;
  XMLCh *pXVar13;
  XMLCh *pXVar14;
  undefined8 *puVar15;
  ReaderMgr *this_00;
  XMLBuffer *pXVar16;
  ulong uVar17;
  undefined1 uVar18;
  XMLCh *pXVar19;
  XMLCh *pXVar20;
  XMLSize_t XVar21;
  DatatypeValidator *pDVar22;
  short sVar23;
  long lVar24;
  ushort *puVar25;
  XMLSize_t XVar26;
  int colonPos;
  XMLBufBid bbXsi;
  int local_7c;
  XMLBuffer *local_78;
  XMLBufferMgr *local_70;
  uint local_64;
  XMLBufferMgr *local_60;
  XMLBuffer *local_58;
  long local_50;
  XMLCh *local_48;
  XMLCh *local_40;
  XMLBuffer *local_38;
  
  if (attCount != 0) {
    XVar26 = 0;
    do {
      pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar26);
      pXVar14 = pKVar12->fKey;
      iVar10 = XMLString::compareNString(pXVar14,L"xmlns:",6);
      if ((pXVar14 == L"xmlns") || (iVar10 == 0)) {
LAB_002b8fe2:
        pXVar13 = pKVar12->fValue;
        updateNSMap(this,pXVar14,pXVar13,this->fRawAttrColonList[XVar26]);
        if (pXVar13 == L"http://www.w3.org/2001/XMLSchema-instance") {
LAB_002b9030:
          this->fSeeXsi = true;
        }
        else {
          pXVar14 = L"http://www.w3.org/2001/XMLSchema-instance";
          if (pXVar13 == (XMLCh *)0x0) {
LAB_002b902a:
            if (*pXVar14 == L'\0') goto LAB_002b9030;
          }
          else {
            pXVar14 = L"http://www.w3.org/2001/XMLSchema-instance";
            do {
              XVar3 = *pXVar13;
              if (XVar3 == L'\0') goto LAB_002b902a;
              pXVar13 = pXVar13 + 1;
              XVar4 = *pXVar14;
              pXVar14 = pXVar14 + 1;
            } while (XVar3 == XVar4);
          }
        }
      }
      else {
        pXVar13 = L"xmlns";
        if (pXVar14 == (XMLCh *)0x0) {
LAB_002b8fdc:
          if (*pXVar13 == L'\0') goto LAB_002b8fe2;
        }
        else {
          pXVar13 = L"xmlns";
          pXVar19 = pXVar14;
          do {
            XVar3 = *pXVar19;
            if (XVar3 == L'\0') goto LAB_002b8fdc;
            pXVar19 = pXVar19 + 1;
            XVar4 = *pXVar13;
            pXVar13 = pXVar13 + 1;
          } while (XVar3 == XVar4);
        }
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 != attCount);
  }
  if (this->fSeeXsi == true) {
    if (attCount != 0) {
      XVar26 = 0;
      do {
        pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                            (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                             XVar26);
        pXVar14 = pKVar12->fKey;
        XVar21 = (XMLSize_t)this->fRawAttrColonList[XVar26];
        pXVar13 = L"";
        if (XVar21 != 0xffffffffffffffff) {
          (this->super_XMLScanner).fURIBuf.fIndex = 0;
          XMLBuffer::append(&(this->super_XMLScanner).fURIBuf,pXVar14,XVar21);
          pXVar13 = (this->super_XMLScanner).fURIBuf.fBuffer;
          pXVar13[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
        }
        uVar11 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar13,Mode_Attribute);
        if (uVar11 == (this->super_XMLScanner).fSchemaNamespaceId) {
          pXVar14 = pXVar14 + XVar21 + 1;
          if (pXVar14 == L"schemaLocation") {
LAB_002b9156:
            parseSchemaLocation(this,pKVar12->fValue,false);
          }
          else {
            pXVar13 = L"schemaLocation";
            if (pXVar14 == (XMLCh *)0x0) {
LAB_002b911a:
              if (*pXVar13 == L'\0') goto LAB_002b9156;
            }
            else {
              pXVar13 = L"schemaLocation";
              pXVar19 = pXVar14;
              do {
                XVar3 = *pXVar19;
                if (XVar3 == L'\0') goto LAB_002b911a;
                pXVar19 = pXVar19 + 1;
                XVar4 = *pXVar13;
                pXVar13 = pXVar13 + 1;
              } while (XVar3 == XVar4);
            }
            if (pXVar14 == L"noNamespaceSchemaLocation") {
LAB_002b9168:
              resolveSchemaGrammar(this,pKVar12->fValue,L"",false);
            }
            else {
              pXVar13 = L"noNamespaceSchemaLocation";
              if (pXVar14 == (XMLCh *)0x0) {
LAB_002b9162:
                if (*pXVar13 == L'\0') goto LAB_002b9168;
              }
              else {
                pXVar13 = L"noNamespaceSchemaLocation";
                do {
                  XVar3 = *pXVar14;
                  if (XVar3 == L'\0') goto LAB_002b9162;
                  pXVar14 = pXVar14 + 1;
                  XVar4 = *pXVar13;
                  pXVar13 = pXVar13 + 1;
                } while (XVar3 == XVar4);
              }
            }
          }
        }
        XVar26 = XVar26 + 1;
      } while (XVar26 != attCount);
    }
    pXVar6 = (this->super_XMLScanner).fValidator;
    if ((pXVar6 != (XMLValidator *)0x0) &&
       (iVar10 = (*pXVar6->_vptr_XMLValidator[0xd])(), attCount != 0 && (char)iVar10 == '\x01')) {
      local_38 = &(this->super_XMLScanner).fURIBuf;
      local_60 = &(this->super_XMLScanner).fBufMgr;
      local_58 = &(this->super_XMLScanner).fPrefixBuf;
      XVar26 = 0;
      do {
        pKVar12 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                            (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                             XVar26);
        pXVar14 = pKVar12->fKey;
        XVar21 = (XMLSize_t)this->fRawAttrColonList[XVar26];
        pXVar13 = L"";
        if (XVar21 != 0xffffffffffffffff) {
          (this->super_XMLScanner).fURIBuf.fIndex = 0;
          XMLBuffer::append(local_38,pXVar14,XVar21);
          pXVar13 = (this->super_XMLScanner).fURIBuf.fBuffer;
          pXVar13[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
        }
        uVar11 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar13,Mode_Attribute);
        pXVar9 = local_60;
        if (uVar11 == (this->super_XMLScanner).fSchemaNamespaceId) {
          pXVar13 = pKVar12->fValue;
          pXVar14 = pXVar14 + XVar21 + 1;
          if (pXVar14 == L"type") {
LAB_002b92dd:
            pXVar16 = XMLBufferMgr::bidOnBuffer(local_60);
            local_70 = pXVar9;
            uVar17 = 0x51;
            uVar5 = 0x4e;
            puVar25 = &DAT_00372bfc;
            do {
              uVar17 = (ulong)uVar5 + (uVar17 >> 0x18) + uVar17 * 0x26;
              uVar5 = *puVar25;
              puVar25 = puVar25 + 1;
            } while (uVar5 != 0);
            for (puVar15 = *(undefined8 **)
                            (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                            (uVar17 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18))
                            * 8); puVar15 != (undefined8 *)0x0; puVar15 = (undefined8 *)puVar15[1])
            {
              puVar7 = (undefined2 *)puVar15[2];
              if (puVar7 == &SchemaSymbols::fgDT_QNAME) goto LAB_002b9390;
              sVar23 = 0x51;
              if (puVar7 == (undefined2 *)0x0) {
LAB_002b9383:
                if (sVar23 == 0) goto LAB_002b9390;
              }
              else {
                lVar24 = 0;
                do {
                  psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar24);
                  if (*psVar1 == 0) {
                    sVar23 = *(short *)((long)puVar7 + lVar24);
                    goto LAB_002b9383;
                  }
                  psVar2 = (short *)((long)puVar7 + lVar24);
                  lVar24 = lVar24 + 2;
                } while (*psVar1 == *psVar2);
              }
            }
            puVar15 = (undefined8 *)0x0;
LAB_002b9390:
            if (puVar15 == (undefined8 *)0x0) {
              pDVar22 = (DatatypeValidator *)0x0;
            }
            else {
              pDVar22 = (DatatypeValidator *)*puVar15;
            }
            local_78 = pXVar16;
            normalizeAttRawValue(this,L"type",pXVar13,pXVar16);
            pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
            pXVar14 = pXVar16->fBuffer;
            pXVar14[pXVar16->fIndex] = L'\0';
            SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar22,pXVar14,pXVar16,true);
            if (pXVar16->fIndex != 0) {
              local_7c = -1;
              pXVar14 = pXVar16->fBuffer;
              pXVar14[pXVar16->fIndex] = L'\0';
              local_64 = XMLScanner::resolveQName
                                   (&this->super_XMLScanner,pXVar14,local_58,Mode_Element,&local_7c)
              ;
              pXVar6 = (this->super_XMLScanner).fValidator;
              local_40 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
              local_40[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
              local_48 = pXVar16->fBuffer;
              local_48[pXVar16->fIndex] = L'\0';
              local_50 = (long)local_7c;
              if (pXVar6[1].fReaderMgr != (ReaderMgr *)0x0) {
                (*((pXVar6[1].fReaderMgr)->super_Locator)._vptr_Locator[1])();
              }
              this_00 = (ReaderMgr *)
                        XMemory::operator_new(0x48,(MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              QName::QName((QName *)this_00,local_40,local_48 + local_50 + 1,local_64,
                           (MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              pXVar6[1].fReaderMgr = this_00;
            }
            XMLBufferMgr::releaseBuffer(local_70,local_78);
          }
          else {
            pXVar19 = L"type";
            if (pXVar14 == (XMLCh *)0x0) {
LAB_002b9292:
              if (*pXVar19 == L'\0') goto LAB_002b92dd;
            }
            else {
              pXVar19 = L"type";
              pXVar20 = pXVar14;
              do {
                XVar3 = *pXVar20;
                if (XVar3 == L'\0') goto LAB_002b9292;
                pXVar20 = pXVar20 + 1;
                XVar4 = *pXVar19;
                pXVar19 = pXVar19 + 1;
              } while (XVar3 == XVar4);
            }
            if (pXVar14 == L"nil") {
LAB_002b94bb:
              pXVar16 = XMLBufferMgr::bidOnBuffer(local_60);
              local_70 = pXVar9;
              uVar17 = 0x62;
              uVar5 = 0x6f;
              puVar25 = &DAT_00372984;
              do {
                uVar17 = (ulong)uVar5 + (uVar17 >> 0x18) + uVar17 * 0x26;
                uVar5 = *puVar25;
                puVar25 = puVar25 + 1;
              } while (uVar5 != 0);
              for (puVar15 = *(undefined8 **)
                              (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                              (uVar17 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18
                                                  )) * 8); puVar15 != (undefined8 *)0x0;
                  puVar15 = (undefined8 *)puVar15[1]) {
                puVar7 = (undefined2 *)puVar15[2];
                if (puVar7 == &SchemaSymbols::fgDT_BOOLEAN) goto LAB_002b9576;
                sVar23 = 0x62;
                if (puVar7 == (undefined2 *)0x0) {
LAB_002b9569:
                  if (sVar23 == 0) goto LAB_002b9576;
                }
                else {
                  lVar24 = 0;
                  do {
                    psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar24);
                    if (*psVar1 == 0) {
                      sVar23 = *(short *)((long)puVar7 + lVar24);
                      goto LAB_002b9569;
                    }
                    psVar2 = (short *)((long)puVar7 + lVar24);
                    lVar24 = lVar24 + 2;
                  } while (*psVar1 == *psVar2);
                }
              }
              puVar15 = (undefined8 *)0x0;
LAB_002b9576:
              if (puVar15 == (undefined8 *)0x0) {
                pDVar22 = (DatatypeValidator *)0x0;
              }
              else {
                pDVar22 = (DatatypeValidator *)*puVar15;
              }
              local_78 = pXVar16;
              normalizeAttRawValue(this,L"nil",pXVar13,pXVar16);
              pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar14 = pXVar16->fBuffer;
              pXVar14[pXVar16->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar22,pXVar14,pXVar16,true);
              XVar21 = pXVar16->fIndex;
              pXVar14 = pXVar16->fBuffer;
              pXVar14[XVar21] = L'\0';
              uVar18 = 1;
              if (pXVar14 == L"true") {
LAB_002b9671:
                pXVar6 = (this->super_XMLScanner).fValidator;
                *(undefined1 *)&pXVar6[1].fScanner = uVar18;
                *(undefined1 *)((long)&pXVar6[1].fScanner + 1) = 1;
              }
              else {
                pXVar19 = L"true";
                if (pXVar14 == (XMLCh *)0x0) {
LAB_002b960a:
                  if (*pXVar19 == L'\0') goto LAB_002b9671;
                }
                else {
                  pXVar19 = L"true";
                  pXVar20 = pXVar14;
                  do {
                    XVar3 = *pXVar20;
                    if (XVar3 == L'\0') goto LAB_002b960a;
                    pXVar20 = pXVar20 + 1;
                    XVar4 = *pXVar19;
                    pXVar19 = pXVar19 + 1;
                  } while (XVar3 == XVar4);
                }
                pXVar14[XVar21] = L'\0';
                pXVar19 = L"false";
                if (pXVar14 == L"false") {
LAB_002b966f:
                  uVar18 = 0;
                  goto LAB_002b9671;
                }
                if (pXVar14 == (XMLCh *)0x0) {
LAB_002b964b:
                  if (*pXVar19 == L'\0') goto LAB_002b966f;
                }
                else {
                  pXVar19 = L"false";
                  pXVar20 = pXVar14;
                  do {
                    XVar3 = *pXVar20;
                    if (XVar3 == L'\0') goto LAB_002b964b;
                    pXVar20 = pXVar20 + 1;
                    XVar4 = *pXVar19;
                    pXVar19 = pXVar19 + 1;
                  } while (XVar3 == XVar4);
                }
                pXVar14[XVar21] = L'\0';
                XMLScanner::emitError
                          (&this->super_XMLScanner,InvalidAttValue,pXVar14,pXVar13,(XMLCh *)0x0,
                           (XMLCh *)0x0);
              }
              XMLBufferMgr::releaseBuffer(local_70,local_78);
            }
            else {
              pXVar19 = L"nil";
              if (pXVar14 == (XMLCh *)0x0) {
LAB_002b94b1:
                if (*pXVar19 == L'\0') goto LAB_002b94bb;
              }
              else {
                pXVar19 = L"nil";
                do {
                  XVar3 = *pXVar14;
                  if (XVar3 == L'\0') goto LAB_002b94b1;
                  pXVar14 = pXVar14 + 1;
                  XVar4 = *pXVar19;
                  pXVar19 = pXVar19 + 1;
                } while (XVar3 == XVar4);
              }
            }
          }
        }
        XVar26 = XVar26 + 1;
      } while (XVar26 != attCount);
    }
  }
  return;
}

Assistant:

void SGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr;

            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {
                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }
            else {
                prefPtr = XMLUni::fgZeroLenString;
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        if (fValidator && fValidator->handlesSchema())
        {
            for (XMLSize_t index = 0; index < attCount; index++)
            {
                // each attribute has the prefix:suffix="value"
                const KVStringPair* curPair = fRawAttrList->elementAt(index);
                const XMLCh* rawPtr = curPair->getKey();
                const XMLCh* prefPtr;

                int   colonInd = fRawAttrColonList[index];

                if (colonInd != -1) {
                    fURIBuf.set(rawPtr, colonInd);
                    prefPtr = fURIBuf.getRawBuffer();
                }
                else {
                    prefPtr = XMLUni::fgZeroLenString;
                }

                // scan for schema type
                if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                    const XMLCh* valuePtr = curPair->getValue();
                    const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                    if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                    {
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiType = bbXsi.getBuffer();

                        // normalize the attribute according to schema whitespace facet
                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                        normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                        if (!fXsiType.isEmpty()) {
                            int colonPos = -1;
                            unsigned int uriId = resolveQName (
                                  fXsiType.getRawBuffer()
                                , fPrefixBuf
                                , ElemStack::Mode_Element
                                , colonPos
                            );
                            ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                        }
                    }
                    else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                    {
                        // normalize the attribute according to schema whitespace facet
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiNil = bbXsi.getBuffer();

                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                        normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                        if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                            ((SchemaValidator*)fValidator)->setNillable(true);
                        else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                            ((SchemaValidator*)fValidator)->setNillable(false);
                        else
                            emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                    }
                }
            }
        }
    }
}